

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O0

Nm_Man_t * Nm_ManCreate(int nSize)

{
  int iVar1;
  Nm_Man_t *__s;
  Nm_Entry_t **ppNVar2;
  Extra_MmFlex_t *pEVar3;
  Nm_Man_t *p;
  int nSize_local;
  
  __s = (Nm_Man_t *)malloc(0x28);
  memset(__s,0,0x28);
  __s->nSizeFactor = 2;
  __s->nGrowthFactor = 3;
  iVar1 = Abc_PrimeCudd(nSize);
  __s->nBins = iVar1;
  ppNVar2 = (Nm_Entry_t **)malloc((long)__s->nBins << 3);
  __s->pBinsI2N = ppNVar2;
  ppNVar2 = (Nm_Entry_t **)malloc((long)__s->nBins << 3);
  __s->pBinsN2I = ppNVar2;
  memset(__s->pBinsI2N,0,(long)__s->nBins << 3);
  memset(__s->pBinsN2I,0,(long)__s->nBins << 3);
  pEVar3 = Extra_MmFlexStart();
  __s->pMem = pEVar3;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the name manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nm_Man_t * Nm_ManCreate( int nSize )
{
    Nm_Man_t * p;
    // allocate the table
    p = ABC_ALLOC( Nm_Man_t, 1 );
    memset( p, 0, sizeof(Nm_Man_t) );
    // set the parameters
    p->nSizeFactor   = 2; // determined the limit on the grow of data before the table resizes
    p->nGrowthFactor = 3; // determined how much the table grows after resizing
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBinsI2N = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    p->pBinsN2I = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    memset( p->pBinsI2N, 0, sizeof(Nm_Entry_t *) * p->nBins );
    memset( p->pBinsN2I, 0, sizeof(Nm_Entry_t *) * p->nBins );
    // start the memory manager
    p->pMem = Extra_MmFlexStart();
    return p;
}